

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.cpp
# Opt level: O2

void ht_del_hash_table(ht_hash_table *ht)

{
  ht_item *item;
  ostream *poVar1;
  int i;
  long lVar2;
  
  for (lVar2 = 0; lVar2 < ht->size; lVar2 = lVar2 + 1) {
    item = ht->items[lVar2];
    if (item != (ht_item *)0x0 && item != &HT_DELETED_ITEM) {
      ht_del_item(item);
    }
  }
  free(ht->items);
  free(ht);
  poVar1 = std::operator<<((ostream *)&std::cout,"delete a hash table");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void ht_del_hash_table(ht_hash_table* ht) {
    for (int i = 0; i < ht->size; i++) {
        ht_item* item = ht->items[i];
        if (item == &HT_DELETED_ITEM) {
            item = nullptr;
            // free(item);
        } else if (item != nullptr) {
            ht_del_item(item);
        }
    }
    free(ht->items);
    free(ht);
    std::cout << "delete a hash table" << std::endl;
}